

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O2

bool __thiscall ODDLParser::OpenDDLExport::handleNode(OpenDDLExport *this,DDLNode *node)

{
  DDLNode *node_00;
  DllNodeList *pDVar1;
  pointer ppDVar2;
  pointer ppDVar3;
  ulong uVar4;
  ulong uVar5;
  string statement;
  string local_48;
  
  if (node != (DDLNode *)0x0) {
    pDVar1 = DDLNode::getChildNodeList(node);
    ppDVar2 = (pDVar1->
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppDVar3 = (pDVar1->
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppDVar2 != ppDVar3) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      uVar5 = 0;
      do {
        uVar4 = uVar5;
        do {
          uVar5 = uVar4 + 1;
          if ((ulong)((long)ppDVar3 - (long)ppDVar2 >> 3) <= uVar5) {
            std::__cxx11::string::~string((string *)&local_48);
            return true;
          }
          node_00 = ppDVar2[uVar4 + 1];
          uVar4 = uVar5;
        } while (node_00 == (DDLNode *)0x0);
        writeNode(this,node_00,&local_48);
        handleNode(this,node_00);
        ppDVar2 = (pDVar1->
                  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        ppDVar3 = (pDVar1->
                  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while( true );
    }
  }
  return true;
}

Assistant:

bool OpenDDLExport::handleNode( DDLNode *node ) {
    if( ddl_nullptr == node ) {
        return true;
    }

    const DDLNode::DllNodeList &childs = node->getChildNodeList();
    if( childs.empty() ) {
        return true;
    }
    DDLNode *current( ddl_nullptr );
    DDLNodeIterator it( childs );
    std::string statement;
    bool success( true );
    while( it.getNext( &current ) ) {
        if( ddl_nullptr != current ) {
            success |= writeNode( current, statement );
            if( !handleNode( current ) ) {
                success = false;
            }
        }
    }

    return success;
}